

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::RegAlloc(LinearScan *this)

{
  uint uVar1;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  IRKind IVar5;
  RegionType RVar6;
  uint32 uVar7;
  uint uVar8;
  uint uVar9;
  BOOL BVar10;
  uint uVar11;
  int iVar12;
  PageAllocator *pageAllocator;
  JitArenaAllocator *pJVar13;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar14;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *this_02;
  LoweredBasicBlock *pLVar15;
  undefined4 *puVar16;
  Type_conflict pSVar17;
  Allocator *this_03;
  Memory *this_04;
  GlobalBailOutRecordDataTable **ppGVar18;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_05;
  uint **ppuVar19;
  ScriptContext *pSVar20;
  Instr *pIVar21;
  Region *pRVar22;
  BailOutInfo *pBVar23;
  BranchInstr *branchInstr;
  LabelInstr *pLVar24;
  GeneratorBailInInstr *bailInInstr;
  bool local_4b1;
  bool local_48b;
  bool local_433;
  uint local_348;
  uint i;
  RegionType curRegType;
  Instr *curr;
  Instr *prevInstr_1;
  Instr *prevInstr;
  Instr *pIStack_320;
  bool isLoopBackEdge;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  bool endOfBasicBlock;
  TrackAllocData local_2f0;
  code *local_2c8;
  undefined8 local_2c0;
  TrackAllocData local_2b8;
  Allocator *local_290;
  Allocator *nativeAllocator;
  NodeBase *local_280;
  undefined1 local_278 [8];
  AutoCodeGenPhase __autoCodeGen;
  SCCLiveness liveness;
  Instr *currentInstr;
  TrackAllocData local_1d8;
  code *local_1b0;
  undefined8 local_1a8;
  TrackAllocData local_1a0;
  code *local_178;
  undefined8 local_170;
  TrackAllocData local_168;
  code *local_140;
  undefined8 local_138;
  TrackAllocData local_130;
  code *local_108;
  undefined8 local_100;
  TrackAllocData local_e8;
  undefined1 local_c0 [8];
  NoRecoverMemoryJitArenaAllocator tempAlloc;
  LinearScan *this_local;
  
  tempAlloc.super_JitArenaAllocator.bvFreeList = (BVSparseNode *)this;
  pageAllocator =
       Memory::ArenaData::GetPageAllocator
                 (&(this->func->m_alloc->super_ArenaAllocator).
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   super_ArenaData);
  Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
            ((NoRecoverMemoryJitArenaAllocator *)local_c0,L"BE-LinearScan",pageAllocator,
             Js::Throw::OutOfMemory);
  this->tempAlloc = (JitArenaAllocator *)local_c0;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_e8,(type_info *)&SList<Lifetime*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
             ,0x6d);
  pJVar13 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           local_c0,&local_e8);
  local_108 = Memory::JitArenaAllocator::Alloc;
  local_100 = 0;
  pSVar14 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,pJVar13,0x4e98c0);
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::SList(pSVar14,(ArenaAllocator *)local_c0);
  this->opHelperSpilledLiveranges = pSVar14;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_130,(type_info *)&SList<Lifetime*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
             ,0x6e);
  pJVar13 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           local_c0,&local_130);
  local_140 = Memory::JitArenaAllocator::Alloc;
  local_138 = 0;
  pSVar14 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,pJVar13,0x4e98c0);
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::SList(pSVar14,(ArenaAllocator *)local_c0);
  this->activeLiveranges = pSVar14;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_168,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
             ,0x6f);
  pJVar13 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           local_c0,&local_168);
  local_178 = Memory::JitArenaAllocator::Alloc;
  local_170 = 0;
  this_01 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,pJVar13,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(this_01,(JitArenaAllocator *)local_c0);
  this->liveOnBackEdgeSyms = this_01;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1a0,(type_info *)&SList<Lifetime*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
             ,0x70);
  pJVar13 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           local_c0,&local_1a0);
  local_1b0 = Memory::JitArenaAllocator::Alloc;
  local_1a8 = 0;
  pSVar14 = (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,pJVar13,0x4e98c0);
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::SList(pSVar14,(ArenaAllocator *)local_c0);
  this->stackPackInUseLiveRanges = pSVar14;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1d8,(type_info *)&SList<StackSlot*,Memory::ArenaAllocator,RealCount>::typeinfo,0
             ,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
             ,0x71);
  pJVar13 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           local_c0,&local_1d8);
  this_02 = (SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *)
            new<Memory::JitArenaAllocator>(0x18,pJVar13,0x4e98c0);
  SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount>::SList(this_02,(ArenaAllocator *)local_c0);
  this->stackSlotsFreeList = this_02;
  pLVar15 = LoweredBasicBlock::New((JitArenaAllocator *)local_c0);
  this->currentBlock = pLVar15;
  liveness._112_8_ = this->func->m_headInstr;
  SCCLiveness::SCCLiveness((SCCLiveness *)&__autoCodeGen.phase,this->func,this->tempAlloc);
  AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)local_278,this->func,LivenessPhase);
  SCCLiveness::Build((SCCLiveness *)&__autoCodeGen.phase);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_278,this->func,LivenessPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_278);
  this->lifetimeList =
       (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)&liveness.extendedLifetimesLoopList;
  this->opHelperBlockList =
       (SList<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)&liveness.lifetimeList.allocator;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)&nativeAllocator,
             &this->opHelperBlockList->
              super_SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>);
  (this->opHelperBlockIter).list =
       (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)nativeAllocator;
  (this->opHelperBlockIter).current = local_280;
  if ((this->opHelperBlockIter).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  this_00 = (this->opHelperBlockIter).list;
  pSVar17 = SListNodeBase<Memory::ArenaAllocator>::Next((this->opHelperBlockIter).current);
  bVar3 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::IsHead(this_00,pSVar17);
  if (bVar3) {
    (this->opHelperBlockIter).current = (NodeBase *)0x0;
  }
  else {
    pSVar17 = SListNodeBase<Memory::ArenaAllocator>::Next((this->opHelperBlockIter).current);
    (this->opHelperBlockIter).current = pSVar17;
  }
  Init(this);
  this_03 = Func::GetNativeCodeDataAllocator(this->func);
  local_290 = this_03;
  if ((*(uint *)&this->func->field_0x240 >> 4 & 1) != 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_2b8,(type_info *)&GlobalBailOutRecordDataTable*::typeinfo,0,
               (ulong)(this->func->m_inlineeId + 1),
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
               ,0x89);
    this_04 = (Memory *)NativeCodeData::Allocator::TrackAllocInfo(this_03,&local_2b8);
    local_2c8 = NativeCodeData::AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable_*>_>::
                AllocZero;
    local_2c0 = 0;
    ppGVar18 = Memory::
               AllocateArray<NativeCodeData::AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable*>>,GlobalBailOutRecordDataTable*,false>
                         (this_04,(AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable_*>_>
                                   *)NativeCodeData::
                                     AllocatorT<NativeCodeData::Array<GlobalBailOutRecordDataTable_*>_>
                                     ::AllocZero,0,(ulong)(this->func->m_inlineeId + 1));
    this->globalBailOutRecordTables = ppGVar18;
    pJVar13 = this->tempAlloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_2f0,(type_info *)&unsigned_int*::typeinfo,0,
               (ulong)(this->func->m_inlineeId + 1),
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
               ,0x8a);
    this_05 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pJVar13,&local_2f0);
    ppuVar19 = Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int*,false>
                         ((Memory *)this_05,
                          (JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,0,
                          (ulong)(this->func->m_inlineeId + 1));
    this->lastUpdatedRowIndices = ppuVar19;
    if ((DAT_01ebb8a3 & 1) != 0) {
      uVar7 = this->func->m_inlineeId;
      pSVar20 = Func::GetScriptContext(this->func);
      pSVar20->bailOutOffsetBytes = pSVar20->bailOutOffsetBytes + (ulong)(uVar7 + 1) * 8;
      uVar7 = this->func->m_inlineeId;
      pSVar20 = Func::GetScriptContext(this->func);
      pSVar20->bailOutRecordBytes = (ulong)(uVar7 + 1) * 8 + pSVar20->bailOutRecordBytes;
    }
  }
  this->m_bailOutRecordCount = 0;
  bVar3 = true;
  pIStack_320 = (Instr *)liveness._112_8_;
  do {
    if (pIStack_320 == (Instr *)0x0) {
      if ((*(uint *)&this->func->field_0x240 >> 4 & 1) != 0) {
        for (local_348 = 0; local_348 <= this->func->m_inlineeId; local_348 = local_348 + 1) {
          if ((this->globalBailOutRecordTables[local_348] != (GlobalBailOutRecordDataTable *)0x0) &&
             (GlobalBailOutRecordDataTable::Finalize
                        (this->globalBailOutRecordTables[local_348],local_290,
                         (JitArenaAllocator *)local_c0), (DAT_01ebb8a3 & 1) != 0)) {
            uVar1 = this->globalBailOutRecordTables[local_348]->length;
            pSVar20 = Func::GetScriptContext(this->func);
            pSVar20->bailOutOffsetBytes = pSVar20->bailOutOffsetBytes + (ulong)uVar1 * 0x10;
            uVar1 = this->globalBailOutRecordTables[local_348]->length;
            pSVar20 = Func::GetScriptContext(this->func);
            pSVar20->bailOutRecordBytes = (ulong)uVar1 * 0x10 + pSVar20->bailOutRecordBytes;
          }
        }
      }
      uVar8 = this->intRegUsedCount;
      uVar9 = this->floatRegUsedCount;
      uVar11 = LinearScanMD::UnAllocatableRegCount(&this->linearScanMD,this->func);
      if (uVar8 + uVar9 != uVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x13b,
                           "((this->intRegUsedCount + this->floatRegUsedCount) == this->linearScanMD.UnAllocatableRegCount(this->func))"
                           ,"RegUsedCount is wrong");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      bVar3 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Empty
                        (&this->activeLiveranges->
                          super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x13c,"(this->activeLiveranges->Empty())","Active list not empty");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      bVar3 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Empty
                        (&this->stackPackInUseLiveRanges->
                          super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x13d,"(this->stackPackInUseLiveRanges->Empty())",
                           "Spilled list not empty");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      bVar3 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::IsValid
                        (&this->opHelperBlockIter);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x13f,"(!this->opHelperBlockIter.IsValid())",
                           "Got to the end with a helper block still on the list?");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      iVar12 = JsUtil::ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                         (&(this->currentBlock->inlineeStack).
                           super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>);
      if (iVar12 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x141,"(this->currentBlock->inlineeStack.Count() == 0)",
                           "this->currentBlock->inlineeStack.Count() == 0");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      InsertOpHelperSpillAndRestores(this);
      uVar8 = Func::GetSourceContextId(this->func);
      uVar9 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ebe7c8,LinearScanPhase,uVar8,uVar9);
      if (bVar3) {
        PrintStats(this);
      }
      uVar8 = Func::GetSourceContextId(this->func);
      uVar9 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,StackPackPhase,uVar8,uVar9);
      if (bVar3) {
        Output::Print(L"---------------------------\n");
      }
      this->func->allowRemoveBailOutArgInstr = true;
      SCCLiveness::~SCCLiveness((SCCLiveness *)&__autoCodeGen.phase);
      Memory::NoRecoverMemoryJitArenaAllocator::~NoRecoverMemoryJitArenaAllocator
                ((NoRecoverMemoryJitArenaAllocator *)local_c0);
      return;
    }
    instrStop = pIStack_320->m_next;
    uVar7 = IR::Instr::GetNumber(pIStack_320);
    if (uVar7 == 0) {
      bVar4 = LowererMD::IsAssign(pIStack_320);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x9b,"(LowererMD::IsAssign(instr))","Only expect spill code here");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
    }
    else {
      uVar8 = Func::GetSourceContextId(this->func);
      uVar9 = Func::GetLocalFunctionId(this->func);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,LinearScanPhase,uVar8,uVar9);
      if (bVar4) {
        IR::Instr::Dump(pIStack_320);
      }
      this->currentInstr = pIStack_320;
      bVar4 = IR::Instr::StartsBasicBlock(pIStack_320);
      if ((bVar4) || (bVar3)) {
        bVar3 = false;
        this->currentBlockNumber = this->currentBlockNumber + 1;
      }
      prevInstr._7_1_ = false;
      IVar5 = IR::Instr::GetKind(pIStack_320);
      local_433 = true;
      if (IVar5 != InstrKindLabel) {
        local_433 = IR::Instr::IsProfiledLabelInstr(pIStack_320);
      }
      if (local_433 == false) {
        bVar4 = IR::Instr::IsBranchInstr(pIStack_320);
        if (bVar4) {
          BVar10 = Func::HasTry(this->func);
          if ((BVar10 != 0) && (bVar4 = Func::DoOptimizeTry(this->func), bVar4)) {
            ProcessEHRegionBoundary(this,pIStack_320);
          }
          bVar4 = IsInLoop(this);
          local_48b = false;
          if (bVar4) {
            uVar7 = IR::Instr::GetNumber(pIStack_320);
            local_48b = (this->curLoop->regAlloc).loopEnd <= uVar7;
          }
          prevInstr._7_1_ = local_48b;
        }
      }
      else {
        pLVar24 = IR::Instr::AsLabelInstr(pIStack_320);
        this->lastLabel = pLVar24;
        if (this->lastLabel->m_loweredBasicBlock == (LoweredBasicBlock *)0x0) {
          bVar4 = LoweredBasicBlock::HasData(this->currentBlock);
          if (bVar4) {
            pIVar21 = IR::Instr::GetPrevRealInstrOrLabel(pIStack_320);
            if (pIVar21 == (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar16 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                 ,0xbf,"(prevInstr)","prevInstr");
              if (!bVar4) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar16 = 0;
            }
            bVar4 = IR::Instr::HasFallThrough(pIVar21);
            if (!bVar4) {
              pLVar15 = LoweredBasicBlock::New((JitArenaAllocator *)local_c0);
              this->currentBlock = pLVar15;
            }
          }
        }
        else {
          pIVar21 = IR::Instr::GetPrevRealInstrOrLabel(pIStack_320);
          if (pIVar21 == (Instr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0xb4,"(prevInstr)","prevInstr");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 0;
          }
          bVar4 = IR::Instr::HasFallThrough(pIVar21);
          if (bVar4) {
            LoweredBasicBlock::Delete(this->currentBlock,(JitArenaAllocator *)local_c0);
          }
          this->currentBlock = this->lastLabel->m_loweredBasicBlock;
        }
        pRVar22 = IR::LabelInstr::GetRegion(this->lastLabel);
        this->currentRegion = pRVar22;
      }
      bVar4 = RemoveDeadStores(this,pIStack_320);
      if (!bVar4) {
        bVar4 = IR::Instr::HasBailOutInfo(pIStack_320);
        if ((bVar4) &&
           (pBVar23 = IR::Instr::GetBailOutInfo(pIStack_320),
           pBVar23->bailOutRecord == (BailOutRecord *)0x0)) {
          if ((DAT_01ea9ee9 & 1) != 0) {
            for (_i = pIStack_320; _i->globOptInstrString == (char16 *)0x0; _i = _i->m_prev) {
            }
            IR::Instr::Dump(pIStack_320);
            IR::Instr::DumpGlobOptInstrString(_i);
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xeb,"(false)","Lazy bailout: bailOutRecord not allocated");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar16 = 0;
        }
        bVar4 = IR::Instr::HasBailOutInfo(pIStack_320);
        if ((bVar4) && (bVar4 = IR::Instr::HasLazyBailOut(pIStack_320), !bVar4)) {
          if ((this->currentRegion != (Region *)0x0) &&
             (((RVar6 = Region::GetType(this->currentRegion), RVar6 == RegionTypeTry ||
               (RVar6 == RegionTypeCatch)) || (RVar6 == RegionTypeFinally)))) {
            *(uint *)&this->func->field_0x240 =
                 *(uint *)&this->func->field_0x240 & 0xffffffdf | 0x20;
          }
          FillBailOutRecord(this,pIStack_320);
        }
        SetSrcRegs(this,pIStack_320);
        EndDeadLifetimes(this,pIStack_320,prevInstr._7_1_);
        bVar4 = IR::Instr::IsBranchInstr(pIStack_320);
        if (bVar4) {
          branchInstr = IR::Instr::AsBranchInstr(pIStack_320);
          ProcessSecondChanceBoundary(this,branchInstr);
        }
        CheckIfInLoop(this,pIStack_320);
        if (prevInstr._7_1_ != false) {
          EndDeadLifetimes(this,pIStack_320,false);
        }
        CheckOpHelper(this,pIStack_320);
        KillImplicitRegs(this,pIStack_320);
        ProcessLazyBailOut(this,pIStack_320);
        AllocateNewLifetimes(this,pIStack_320);
        SetDstReg(this,pIStack_320);
        EndDeadOpHelperLifetimes(this,pIStack_320);
        IVar5 = IR::Instr::GetKind(pIStack_320);
        local_4b1 = true;
        if (IVar5 != InstrKindLabel) {
          local_4b1 = IR::Instr::IsProfiledLabelInstr(pIStack_320);
        }
        if (local_4b1 != false) {
          pLVar24 = IR::Instr::AsLabelInstr(pIStack_320);
          ProcessSecondChanceBoundary(this,pLVar24);
        }
        CheckInvariants(this);
        bVar4 = IR::Instr::EndsBasicBlock(pIStack_320);
        if (bVar4) {
          bVar3 = true;
        }
        if (pIStack_320->m_opcode == GeneratorBailInLabel) {
          bailInInstr = IR::Instr::AsGeneratorBailInInstr(pIStack_320);
          instrStop = GeneratorBailIn::GenerateBailIn(&this->bailIn,bailInInstr);
        }
      }
    }
    pIStack_320 = instrStop;
  } while( true );
}

Assistant:

void
LinearScan::RegAlloc()
{
    NoRecoverMemoryJitArenaAllocator tempAlloc(_u("BE-LinearScan"), this->func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
    this->tempAlloc = &tempAlloc;
    this->opHelperSpilledLiveranges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->activeLiveranges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->liveOnBackEdgeSyms = JitAnew(&tempAlloc, BVSparse<JitArenaAllocator>, &tempAlloc);
    this->stackPackInUseLiveRanges = JitAnew(&tempAlloc, SList<Lifetime *>, &tempAlloc);
    this->stackSlotsFreeList = JitAnew(&tempAlloc, SList<StackSlot *>, &tempAlloc);
    this->currentBlock = LoweredBasicBlock::New(&tempAlloc);

    IR::Instr *currentInstr = this->func->m_headInstr;

    SCCLiveness liveness(this->func, this->tempAlloc);
    BEGIN_CODEGEN_PHASE(this->func, Js::LivenessPhase);

    // Build the lifetime list
    liveness.Build();
    END_CODEGEN_PHASE(this->func, Js::LivenessPhase);


    this->lifetimeList = &liveness.lifetimeList;

    this->opHelperBlockList = &liveness.opHelperBlockList;
    this->opHelperBlockIter = SList<OpHelperBlock>::Iterator(this->opHelperBlockList);
    this->opHelperBlockIter.Next();

    this->Init();

    NativeCodeData::Allocator * nativeAllocator = this->func->GetNativeCodeDataAllocator();
    if (func->hasBailout)
    {
        this->globalBailOutRecordTables = NativeCodeDataNewArrayZ(nativeAllocator, GlobalBailOutRecordDataTable *,  func->m_inlineeId + 1);
        this->lastUpdatedRowIndices = JitAnewArrayZ(this->tempAlloc, uint *, func->m_inlineeId + 1);

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
        {
            this->func->GetScriptContext()->bailOutOffsetBytes += (sizeof(GlobalBailOutRecordDataTable *) * (func->m_inlineeId + 1));
            this->func->GetScriptContext()->bailOutRecordBytes += (sizeof(GlobalBailOutRecordDataTable *) * (func->m_inlineeId + 1));
        }
#endif
    }

    m_bailOutRecordCount = 0;
    bool endOfBasicBlock = true;
    FOREACH_INSTR_EDITING(instr, instrNext, currentInstr)
    {
        if (instr->GetNumber() == 0)
        {
            AssertMsg(LowererMD::IsAssign(instr), "Only expect spill code here");
            continue;
        }

#if DBG_DUMP && defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::LinearScanPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
        {
            instr->Dump();
        }
#endif // DBG

        this->currentInstr = instr;
        if (instr->StartsBasicBlock() || endOfBasicBlock)
        {
            endOfBasicBlock = false;
            ++currentBlockNumber;
        }

        bool isLoopBackEdge = false;
        if (instr->IsLabelInstr())
        {
            this->lastLabel = instr->AsLabelInstr();
            if (this->lastLabel->m_loweredBasicBlock)
            {
                IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                Assert(prevInstr);
                if (prevInstr->HasFallThrough())
                {
                    this->currentBlock->Delete(&tempAlloc);
                }
                this->currentBlock = this->lastLabel->m_loweredBasicBlock;
            }
            else if (currentBlock->HasData())
            {
                // Check if the previous block has fall-through. If so, retain the block info. If not, create empty info.
                IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                Assert(prevInstr);
                if (!prevInstr->HasFallThrough())
                {
                    currentBlock = LoweredBasicBlock::New(&tempAlloc);
                }
            }
            this->currentRegion = this->lastLabel->GetRegion();
        }
        else if (instr->IsBranchInstr())
        {
            if (this->func->HasTry() && this->func->DoOptimizeTry())
            {
                this->ProcessEHRegionBoundary(instr);
            }

            isLoopBackEdge = this->IsInLoop() && instr->GetNumber() >= this->curLoop->regAlloc.loopEnd;
        }

        if (this->RemoveDeadStores(instr))
        {
            continue;
        }

#if DBG
        // Since not all call instructions are forwarded to ChangeToHelperCall, we might have
        // missed allocating bailout records for them. Additionally, some instructions might
        // end up being lowered differently, so the lazy bailout is not on a CALL instruction
        // anymore. Use this opportunity to detect them.
        // Note that the dump for the instruction will also be printed with -ForcePostLowerGlobOptInstrString
        if (instr->HasBailOutInfo() && instr->GetBailOutInfo()->bailOutRecord == nullptr)
        {
            if (CONFIG_FLAG(ForcePostLowerGlobOptInstrString))
            {
                // The instruction has already been lowered, find the start to get the globopt dump
                IR::Instr *curr = instr;
                while (curr->globOptInstrString == nullptr)
                {
                    curr = curr->m_prev;
                }

                instr->Dump();
                curr->DumpGlobOptInstrString();
            }

            AssertMsg(false, "Lazy bailout: bailOutRecord not allocated");
        }
#endif

        if (instr->HasBailOutInfo() && !instr->HasLazyBailOut())
        {
            if (this->currentRegion)
            {
                RegionType curRegType = this->currentRegion->GetType();
                if (curRegType == RegionTypeTry || curRegType == RegionTypeCatch || curRegType == RegionTypeFinally)
                {
                    this->func->hasBailoutInEHRegion = true;
                }
            }

            this->FillBailOutRecord(instr);
        }

        this->SetSrcRegs(instr);
        this->EndDeadLifetimes(instr, isLoopBackEdge);

        if (instr->IsBranchInstr())
        {
            this->ProcessSecondChanceBoundary(instr->AsBranchInstr());
        }
        this->CheckIfInLoop(instr);
        if (isLoopBackEdge)
        {
            this->EndDeadLifetimes(instr, false);
        }

        this->CheckOpHelper(instr);

        this->KillImplicitRegs(instr);

        this->ProcessLazyBailOut(instr);

        this->AllocateNewLifetimes(instr);
        this->SetDstReg(instr);

        this->EndDeadOpHelperLifetimes(instr);

        if (instr->IsLabelInstr())
        {
            this->ProcessSecondChanceBoundary(instr->AsLabelInstr());
        }

#if DBG
        this->CheckInvariants();
#endif // DBG

        if(instr->EndsBasicBlock())
        {
            endOfBasicBlock = true;
        }

        if (instr->IsGeneratorBailInInstr())
        {
            instrNext = this->bailIn.GenerateBailIn(instr->AsGeneratorBailInInstr());
        }
    } NEXT_INSTR_EDITING;

    if (func->hasBailout)
    {
        for (uint i = 0; i <= func->m_inlineeId; i++)
        {
            if (globalBailOutRecordTables[i] != nullptr)
            {
                globalBailOutRecordTables[i]->Finalize(nativeAllocator, &tempAlloc);
#ifdef PROFILE_BAILOUT_RECORD_MEMORY
                if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
                {
                    func->GetScriptContext()->bailOutOffsetBytes += sizeof(GlobalBailOutRecordDataRow) * globalBailOutRecordTables[i]->length;
                    func->GetScriptContext()->bailOutRecordBytes += sizeof(GlobalBailOutRecordDataRow) * globalBailOutRecordTables[i]->length;
                }
#endif
            }
        }
    }

    AssertMsg((this->intRegUsedCount + this->floatRegUsedCount) == this->linearScanMD.UnAllocatableRegCount(this->func) , "RegUsedCount is wrong");
    AssertMsg(this->activeLiveranges->Empty(), "Active list not empty");
    AssertMsg(this->stackPackInUseLiveRanges->Empty(), "Spilled list not empty");

    AssertMsg(!this->opHelperBlockIter.IsValid(), "Got to the end with a helper block still on the list?");

    Assert(this->currentBlock->inlineeStack.Count() == 0);
    this->InsertOpHelperSpillAndRestores();

#if _M_IX86
# if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.Instrument.IsEnabled(Js::LinearScanPhase, this->func->GetSourceContextId(),this->func->GetLocalFunctionId()))
    {
        this->DynamicStatsInstrument();
    }
# endif
#endif

#if DBG_DUMP
    if (PHASE_STATS(Js::LinearScanPhase, this->func))
    {
        this->PrintStats();
    }
    if (PHASE_TRACE(Js::StackPackPhase, this->func))
    {
        Output::Print(_u("---------------------------\n"));
    }
#endif // DBG_DUMP
    DebugOnly(this->func->allowRemoveBailOutArgInstr = true);
}